

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O1

void __thiscall FTextureManager::AddTexturesForWad(FTextureManager *this,int wadnum)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FTextureID FVar7;
  FTexture *texture;
  int usetype;
  FString Name;
  FString local_40;
  int local_38;
  uint local_34;
  
  uVar6 = (this->Textures).Count;
  FWadCollection::GetNumLumps(&Wads);
  TArray<int,_int>::Grow(&this->FirstTextureForFile,1);
  (this->FirstTextureForFile).Array[(this->FirstTextureForFile).Count] = uVar6;
  puVar1 = &(this->FirstTextureForFile).Count;
  *puVar1 = *puVar1 + 1;
  local_34 = uVar6;
  AddGroup(this,wadnum,1,3);
  AddGroup(this,wadnum,0xe,4);
  LoadTextureX(this,wadnum);
  AddGroup(this,wadnum,2,2);
  AddGroup(this,wadnum,5,10);
  iVar3 = FWadCollection::GetFirstLump(&Wads,wadnum);
  local_38 = wadnum;
  iVar4 = FWadCollection::GetLastLump(&Wads,wadnum);
  if (iVar3 <= iVar4) {
    do {
      local_40.Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      FWadCollection::GetLumpName(&Wads,&local_40,iVar3);
      iVar5 = FWadCollection::GetLumpNamespace(&Wads,iVar3);
      if (iVar5 == 0xf) {
        iVar5 = FWadCollection::CheckNumForName(&Wads,local_40.Chars,0xf);
        usetype = 8;
LAB_00639d22:
        if (iVar3 == iVar5) {
LAB_00639d27:
          texture = FTexture::CreateTexture(iVar3,usetype);
          if (texture != (FTexture *)0x0) {
            AddTexture(this,texture);
          }
        }
      }
      else if (iVar5 == 0) {
        uVar6 = FWadCollection::GetLumpFlags(&Wads,iVar3);
        if ((uVar6 & 2) == 0) {
          bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,(char *)"");
          if (!bVar2) {
            bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"THINGS");
            if (!bVar2) {
              bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"LINEDEFS");
              if (!bVar2) {
                bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"SIDEDEFS");
                if (!bVar2) {
                  bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"VERTEXES");
                  if (!bVar2) {
                    bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"SEGS");
                    if (!bVar2) {
                      bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"SSECTORS");
                      if (!bVar2) {
                        bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"NODES");
                        if (!bVar2) {
                          bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"SECTORS");
                          if (!bVar2) {
                            bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"REJECT");
                            if (!bVar2) {
                              bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"BLOCKMAP");
                              if (!bVar2) {
                                bVar2 = FWadCollection::CheckLumpName(&Wads,iVar3,"BEHAVIOR");
                                if (!bVar2) {
                                  iVar5 = FWadCollection::CheckNumForName(&Wads,local_40.Chars,0xf);
                                  if (iVar3 == iVar5) {
                                    FVar7 = CheckForTexture(this,local_40.Chars,4,0);
                                    if (FVar7.texnum < 0) {
                                      usetype = 8;
                                      goto LAB_00639d27;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else if (0x10 < iVar5) {
        iVar5 = FWadCollection::CheckNumForName(&Wads,local_40.Chars,iVar5);
        usetype = 0xc;
        goto LAB_00639d22;
      }
      FString::~FString(&local_40);
      iVar3 = iVar3 + 1;
    } while (iVar4 + 1 != iVar3);
  }
  iVar3 = local_38;
  LoadTextureDefs(this,local_38,"TEXTURES");
  LoadTextureDefs(this,iVar3,"HIRESTEX");
  AddHiresTextures(this,iVar3);
  SortTexturesByType(this,local_34,(this->Textures).Count);
  return;
}

Assistant:

void FTextureManager::AddTexturesForWad(int wadnum)
{
	int firsttexture = Textures.Size();
	int lumpcount = Wads.GetNumLumps();

	FirstTextureForFile.Push(firsttexture);

	// First step: Load sprites
	AddGroup(wadnum, ns_sprites, FTexture::TEX_Sprite);

	// When loading a Zip, all graphics in the patches/ directory should be
	// added as well.
	AddGroup(wadnum, ns_patches, FTexture::TEX_WallPatch);

	// Second step: TEXTUREx lumps
	LoadTextureX(wadnum);

	// Third step: Flats
	AddGroup(wadnum, ns_flats, FTexture::TEX_Flat);

	// Fourth step: Textures (TX_)
	AddGroup(wadnum, ns_newtextures, FTexture::TEX_Override);

	// Sixth step: Try to find any lump in the WAD that may be a texture and load as a TEX_MiscPatch
	int firsttx = Wads.GetFirstLump(wadnum);
	int lasttx = Wads.GetLastLump(wadnum);

	for (int i= firsttx; i <= lasttx; i++)
	{
		bool skin = false;
		FString Name;
		Wads.GetLumpName(Name, i);

		// Ignore anything not in the global namespace
		int ns = Wads.GetLumpNamespace(i);
		if (ns == ns_global)
		{
			// In Zips all graphics must be in a separate namespace.
			if (Wads.GetLumpFlags(i) & LUMPF_ZIPFILE) continue;

			// Ignore lumps with empty names.
			if (Wads.CheckLumpName(i, "")) continue;

			// Ignore anything belonging to a map
			if (Wads.CheckLumpName(i, "THINGS")) continue;
			if (Wads.CheckLumpName(i, "LINEDEFS")) continue;
			if (Wads.CheckLumpName(i, "SIDEDEFS")) continue;
			if (Wads.CheckLumpName(i, "VERTEXES")) continue;
			if (Wads.CheckLumpName(i, "SEGS")) continue;
			if (Wads.CheckLumpName(i, "SSECTORS")) continue;
			if (Wads.CheckLumpName(i, "NODES")) continue;
			if (Wads.CheckLumpName(i, "SECTORS")) continue;
			if (Wads.CheckLumpName(i, "REJECT")) continue;
			if (Wads.CheckLumpName(i, "BLOCKMAP")) continue;
			if (Wads.CheckLumpName(i, "BEHAVIOR")) continue;

			// Don't bother looking at this lump if something later overrides it.
			if (Wads.CheckNumForName(Name, ns_graphics) != i) continue;

			// skip this if it has already been added as a wall patch.
			if (CheckForTexture(Name, FTexture::TEX_WallPatch, 0).Exists()) continue;
		}
		else if (ns == ns_graphics)
		{
			// Don't bother looking this lump if something later overrides it.
			if (Wads.CheckNumForName(Name, ns_graphics) != i) continue;
		}
		else if (ns >= ns_firstskin)
		{
			// Don't bother looking this lump if something later overrides it.
			if (Wads.CheckNumForName(Name, ns) != i) continue;
			skin = true;
		}
		else continue;

		// Try to create a texture from this lump and add it.
		// Unfortunately we have to look at everything that comes through here...
		FTexture *out = FTexture::CreateTexture(i, skin ? FTexture::TEX_SkinGraphic : FTexture::TEX_MiscPatch);

		if (out != NULL) 
		{
			AddTexture (out);
		}
	}

	// Check for text based texture definitions
	LoadTextureDefs(wadnum, "TEXTURES");
	LoadTextureDefs(wadnum, "HIRESTEX");

	// Seventh step: Check for hires replacements.
	AddHiresTextures(wadnum);

	SortTexturesByType(firsttexture, Textures.Size());
}